

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

void __thiscall ExchangeCompilation_Empty_Test::TestBody(ExchangeCompilation_Empty_Test *this)

{
  uint generation;
  mapped_type *pmVar1;
  string *psVar2;
  parser<pstore::exchange::import_ns::callbacks> *ppVar3;
  typed_address<pstore::indirect_string> addr;
  database *pdVar4;
  char *pcVar5;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  *message;
  _func_int **message_00;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  AssertHelper local_478;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  mock_mutex mutex_1;
  AssertionResult gtest_ar_;
  shared_ptr<const_pstore::repo::compilation> imported_compilation;
  AssertHelper local_418;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  array<const_char_*,_1UL> names;
  char *triple;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  digest compilation_digest;
  AssertionResult gtest_ar__1;
  coord local_2b0;
  const_iterator pos;
  string_mapping imported_names;
  string_mapping exported_names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  ostringstream exported_compilation_stream;
  ostringstream exported_names_stream;
  
  triple = "triple";
  names._M_elems[0] = (_Type)anon_var_dwarf_b1aea;
  indir_strings._M_h._M_buckets = &indir_strings._M_h._M_single_bucket;
  indir_strings._M_h._M_bucket_count = 1;
  indir_strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indir_strings._M_h._M_element_count = 0;
  indir_strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indir_strings._M_h._M_rehash_policy._M_next_resize = 0;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar4 = &(this->super_ExchangeCompilation).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container = &indir_strings;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar4,names._M_elems,&triple,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            (&exported_names,pdVar4);
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_names_stream);
  generation = pstore::database::get_current_revision(pdVar4);
  message_00 = (_func_int **)0x1c5bef;
  std::__cxx11::string::string((string *)&pos,"",(allocator *)&compilation_parser);
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&exported_names_stream.super_ostream_base,(indent)0x0,pdVar4,generation,(string *)&pos,
             &exported_names,false);
  std::__cxx11::string::~string((string *)&pos);
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_compilation_stream);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&compilation_parser,(mutex_type *)&imported_compilation);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&pos,pdVar4,
             (lock_type *)&compilation_parser);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&compilation_parser);
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&compilation_parser,"triple",(allocator *)&gtest_ar_);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&compilation_parser);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
          )pstore::repo::compilation::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                     ((transaction<std::unique_lock<mock_mutex>_> *)&pos,
                      (typed_address<pstore::indirect_string>)(pmVar1->a_).a_,
                      (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                       )imported_names.adder_.views_.
                        super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                      (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                       )imported_names.adder_.views_.
                        super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&compilation_parser);
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)&compilation_parser,(extent<pstore::repo::compilation> *)pdVar4);
  pcVar5 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            (&exported_compilation_stream.super_ostream_base,(indent)0x0,pdVar4,
             (compilation *)
             compilation_parser.singletons_._M_t.
             super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
             ._M_head_impl,&exported_names,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&compilation_parser.stack_);
  pstore::transaction_base::commit((transaction_base *)&pos);
  std::_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::
  ~_Vector_base((_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *
                )&imported_names);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&pos);
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,&mutex_1);
  pdVar4 = &(this->super_ExchangeCompilation).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&compilation_index,pdVar4,
             (lock_type *)&pos);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  anon_unknown.dwarf_9d963::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos,
             (transaction *)&compilation_index,&imported_names);
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
  ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar2);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0;
  if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&fragment_index,pdVar4,true);
    anon_unknown.dwarf_9d963::import_compilation_parser
              (&compilation_parser,(transaction *)&compilation_index,&imported_names,&fragment_index
               ,&compilation_digest);
    psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                       (&exported_compilation_stream);
    ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       (&compilation_parser,psVar2);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = compilation_parser.error_._M_value == 0;
    if (compilation_parser.error_._M_value == 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pstore::transaction_base::commit((transaction_base *)&compilation_index);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&compilation_parser);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fragment_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
      pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
                ((transaction<std::unique_lock<mock_mutex>_> *)&compilation_index);
      pstore::index::
      get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&compilation_index,pdVar4,true);
      pstore::index::
      hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
      ::find<pstore::uint128,void>
                (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                       *)compilation_index.
                         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,pdVar4,&compilation_digest);
      memset(&compilation_parser.stack_,0,0xd8);
      local_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addr.a_.a_ = (address)&pos;
      compilation_parser.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
            )(__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
              )pdVar4;
      testing::internal::
      CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                ((internal *)&imported_compilation,"pos","compilation_index->end (import_db_)",
                 (iterator_base<true> *)addr.a_.a_,(iterator_base<false> *)&compilation_parser);
      std::
      unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      ::~unique_ptr((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                     *)&local_2e0);
      if ((char)imported_compilation.
                super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == '\0') {
        testing::Message::Message((Message *)&compilation_parser);
        std::operator<<((ostream *)
                        ((long)compilation_parser.singletons_._M_t.
                               super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                               .
                               super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                               ._M_head_impl + 0x10),
                        "Compilation was not found in the index after import");
        if (imported_compilation.
            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          message_00 = (imported_compilation.
                        super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0xc3,(char *)message_00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&compilation_parser);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
             )compilation_parser.singletons_._M_t.
              super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
              .
              super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
             )0x0) {
          (**(code **)(*(long *)compilation_parser.singletons_._M_t.
                                super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                .
                                super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                                ._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&imported_compilation.
                          super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&imported_compilation.
                          super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
        pstore::index::
        hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::iterator_base<true>::operator*(&pos);
        pstore::database::getro<pstore::repo::compilation,void>
                  ((database *)&imported_compilation,(extent<pstore::repo::compilation> *)pdVar4);
        (anonymous_namespace)::load_string_abi_cxx11_
                  ((string *)&compilation_parser,(_anonymous_namespace_ *)pdVar4,
                   *(database **)
                    (CONCAT71(imported_compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._1_7_,
                              (char)imported_compilation.
                                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr) + 8),addr);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)&gtest_ar_,
                   "load_string (import_db_, imported_compilation->triple ())","triple",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compilation_parser,&triple);
        std::__cxx11::string::~string((string *)&compilation_parser);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&compilation_parser);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&fragment_index,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0xc6,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&fragment_index,(Message *)&compilation_parser);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fragment_index);
          if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               )compilation_parser.singletons_._M_t.
                super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                .
                super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               )0x0) {
            (**(code **)(*(long *)compilation_parser.singletons_._M_t.
                                  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                  .
                                  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_._0_4_ =
             *(undefined4 *)
              (CONCAT71(imported_compilation.
                        super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._1_7_,
                        (char)imported_compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr) + 0x10);
        fragment_index.
        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&compilation_parser,"imported_compilation->size ()","0U",
                   (uint *)&gtest_ar_,(uint *)&fragment_index);
        if ((char)compilation_parser.singletons_._M_t.
                  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                  .
                  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                  ._M_head_impl == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          std::operator<<((ostream *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10),
                          "The compilation should contain no definitions");
          if (compilation_parser.stack_.c.
              super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
            message = (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)0x1c5bef;
          }
          else {
            message = *compilation_parser.stack_.c.
                       super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&fragment_index,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,199,(char *)message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&fragment_index,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fragment_index);
          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&compilation_parser.stack_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&imported_compilation.
                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::
      unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      ::~unique_ptr(&pos.pos_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&compilation_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_00135fcb;
    }
    testing::Message::Message((Message *)&local_478);
    std::operator<<((ostream *)&(local_478.data_)->line,"JSON error was: ");
    (**(code **)(*(long *)compilation_parser.error_._M_cat + 0x20))
              (&imported_compilation,compilation_parser.error_._M_cat,
               compilation_parser.error_._M_value);
    std::operator<<((ostream *)&(local_478.data_)->line,(string *)&imported_compilation);
    std::operator<<((ostream *)&(local_478.data_)->line,' ');
    local_2b0 = compilation_parser.coordinate_;
    pstore::json::operator<<((ostream *)&(local_478.data_)->line,&local_2b0);
    std::operator<<((ostream *)&(local_478.data_)->line,'\n');
    psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                       (&exported_compilation_stream);
    std::operator<<((ostream *)&(local_478.data_)->line,(string *)psVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0xb7,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&imported_compilation);
    if (local_478.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_478.data_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&compilation_parser);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fragment_index.
                super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    testing::Message::Message((Message *)&fragment_index);
    std::operator<<((ostream *)
                    (CONCAT44(fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),"JSON error was: ");
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&compilation_parser,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::operator<<((ostream *)
                    (CONCAT44(fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),(string *)&compilation_parser);
    std::operator<<((ostream *)
                    (CONCAT44(fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),' ');
    gtest_ar__1._0_8_ = pos.visited_parents_.c_._M_elems[9].position;
    pstore::json::operator<<
              ((ostream *)
               (CONCAT44(fragment_index.
                         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         fragment_index.
                         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) + 0x10),(coord *)&gtest_ar__1);
    std::operator<<((ostream *)
                    (CONCAT44(fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),'\n');
    psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
    std::operator<<((ostream *)
                    (CONCAT44(fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),(string *)psVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&imported_compilation,(internal *)&gtest_ar_,
               (AssertionResult *)"name_parser.has_error ()","true","false",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0xad,(char *)CONCAT71(imported_compilation.
                                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._1_7_,
                                      (char)imported_compilation.
                                            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr));
    testing::internal::AssertHelper::operator=(&local_478,(Message *)&fragment_index);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&imported_compilation);
    std::__cxx11::string::~string((string *)&compilation_parser);
    if ((long *)CONCAT44(fragment_index.
                         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         fragment_index.
                         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(fragment_index.
                                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     fragment_index.
                                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&compilation_index);
LAB_00135fcb:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_compilation_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_names_stream);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&exported_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&indir_strings._M_h);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, Empty) {
    using namespace pstore::exchange;
    static constexpr auto comments = false;
    static constexpr auto name_index = pstore::trailer::indices::name;

    constexpr auto * triple = "triple";
    std::array<pstore::gsl::czstring, 1> names{{triple}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    export_ns::ostringstream exported_compilation_stream;
    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        std::vector<pstore::repo::definition> definitions;
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }



    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    import_ns::string_mapping imported_names;
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();

        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();

        transaction.commit ();
    }


    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";
    auto const imported_compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, imported_compilation->triple ()), triple);
    ASSERT_EQ (imported_compilation->size (), 0U)
        << "The compilation should contain no definitions";
}